

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O1

void __thiscall VectorsTest_FP3Norm_Test::TestBody(VectorsTest_FP3Norm_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_401c000000000000;
  local_20.data_ = (AssertHelperData *)&DAT_401c000000000000;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"v.norm()","(FP)7",(double *)&local_28,(double *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0xf1,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VectorsTest, FP3Norm)
{
    FP3 v(2, 3, 6);
    ASSERT_EQ(v.norm(), (FP)7);
}